

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer.cpp
# Opt level: O0

string * __thiscall
big_integer::to_string_abi_cxx11_(string *__return_storage_ptr__,big_integer *this)

{
  bool bVar1;
  uint32_t __val;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  char *pcVar5;
  string local_78;
  undefined1 local_51;
  undefined1 local_50 [8];
  big_integer BI;
  allocator<char> local_19;
  big_integer *local_18;
  big_integer *this_local;
  string *outStr;
  
  local_18 = this;
  this_local = (big_integer *)__return_storage_ptr__;
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->digits);
  if ((bVar1) ||
     ((sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->digits),
      sVar2 == 1 &&
      (pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->digits,0), *pvVar3 == 0)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"0",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    big_integer((big_integer *)local_50,this);
    local_51 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    while( true ) {
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
      bVar1 = false;
      if (sVar2 == 1) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,0);
        bVar1 = *pvVar4 == 0;
      }
      if (bVar1) break;
      __val = div_long_short((big_integer *)local_50,10);
      std::__cxx11::to_string(&local_78,__val);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
    pcVar5 = "-";
    if ((char)BI.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == '\x01') {
      pcVar5 = "";
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar5);
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(__first,__last);
    local_51 = 1;
    ~big_integer((big_integer *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string big_integer::to_string() const {
    if (digits.empty() || (digits.size() == 1 && digits[0] == 0)) {
        return "0";
    } else {
        big_integer BI(*this);
        std::string outStr;

        while (!(BI.digits.size() == 1 && BI.digits[0] == 0)) {
            outStr += std::to_string(BI.div_long_short(10));
        }
        outStr += (BI.sign == 1 ? "" : "-");
        std::reverse(outStr.begin(), outStr.end());
        return outStr;
    }
}